

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O2

int parse_ignore(ly_ctx *ctx,char *data,char *endstr,uint *len)

{
  int iVar1;
  size_t sVar2;
  ulong __n;
  
  sVar2 = strlen(endstr);
  __n = sVar2 & 0xffffffff;
  while( true ) {
    if (*data == '\0') {
      ly_vlog(ctx,LYE_XML_MISS,LY_VLOG_NONE,(void *)0x0,"closing sequence",endstr);
      return 1;
    }
    iVar1 = strncmp(data,endstr,__n);
    if (iVar1 == 0) break;
    data = data + 1;
    sVar2 = (size_t)((uint)sVar2 + 1);
  }
  *len = (uint)sVar2;
  return 0;
}

Assistant:

static int
parse_ignore(struct ly_ctx *ctx, const char *data, const char *endstr, unsigned int *len)
{
    unsigned int slen;
    const char *c = data;

    slen = strlen(endstr);

    while (*c && strncmp(c, endstr, slen)) {
        c++;
    }
    if (!*c) {
        LOGVAL(ctx, LYE_XML_MISS, LY_VLOG_NONE, NULL, "closing sequence", endstr);
        return EXIT_FAILURE;
    }
    c += slen;

    *len = c - data;
    return EXIT_SUCCESS;
}